

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O2

int VP8GetThreadMethod(WebPDecoderOptions *options,WebPHeaderStructure *headers,int width,int height
                      )

{
  int iVar1;
  
  iVar1 = 0;
  if ((options != (WebPDecoderOptions *)0x0) && (iVar1 = 0, options->use_threads != 0)) {
    iVar1 = (uint)(0x1ff < width) * 2;
  }
  return iVar1;
}

Assistant:

int VP8GetThreadMethod(const WebPDecoderOptions* const options,
                       const WebPHeaderStructure* const headers,
                       int width, int height) {
  if (options == NULL || options->use_threads == 0) {
    return 0;
  }
  (void)headers;
  (void)width;
  (void)height;
  assert(headers == NULL || !headers->is_lossless);
#if defined(WEBP_USE_THREAD)
  if (width >= MIN_WIDTH_FOR_THREADS) return 2;
#endif
  return 0;
}